

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaB_next(lua_State *L)

{
  GCObject *t;
  int iVar1;
  int iVar2;
  Node *pNVar3;
  long lVar4;
  long lVar5;
  TValue *pTVar6;
  Value *pVVar7;
  long lVar8;
  TValue *pTVar9;
  int iVar10;
  
  luaL_checktype(L,1,5);
  lua_settop(L,2);
  pTVar9 = L->top;
  pTVar6 = &luaO_nilobject_;
  if (L->base < pTVar9) {
    pTVar6 = L->base;
  }
  t = (pTVar6->value).gc;
  iVar10 = pTVar9[-1].tt;
  if (iVar10 == 0) {
    iVar2 = (t->h).sizearray;
    iVar1 = -1;
  }
  else {
    pTVar6 = pTVar9 + -1;
    iVar1 = arrayindex(pTVar6);
    if ((iVar1 < 1) || (iVar2 = (t->h).sizearray, iVar2 < iVar1)) {
      pNVar3 = mainposition(&t->h,pTVar6);
      while( true ) {
        iVar2 = luaO_rawequalObj(&(pNVar3->i_key).tvk,pTVar6);
        if ((iVar2 != 0) ||
           (((3 < iVar10 && ((pNVar3->i_key).nk.tt == 0xb)) &&
            ((pNVar3->i_key).nk.value.gc == (pTVar6->value).gc)))) break;
        pNVar3 = (pNVar3->i_key).nk.next;
        if (pNVar3 == (Node *)0x0) {
          luaG_runerror(L,"invalid key to \'next\'");
        }
      }
      iVar2 = (t->h).sizearray;
      iVar1 = (int)(((long)pNVar3 - (long)(t->h).node) / 0x28) + iVar2;
    }
    else {
      iVar1 = iVar1 + -1;
    }
  }
  iVar10 = 1;
  lVar4 = (long)iVar1 + 1;
  lVar5 = (long)iVar1 << 4;
  do {
    lVar8 = lVar5;
    if (iVar2 <= lVar4) {
      lVar5 = (long)((int)lVar4 - iVar2);
      lVar4 = lVar5 + -1;
      lVar5 = lVar5 * 0x28 + -0x28;
      goto LAB_00108c08;
    }
    lVar4 = lVar4 + 1;
    lVar5 = lVar8 + 0x10;
  } while (*(int *)((long)&(t->h).array[1].tt + lVar8) == 0);
  pTVar9[-1].value.n = (double)(int)lVar4;
  pTVar9[-1].tt = 3;
  pVVar7 = (Value *)((long)&(t->h).array[1].value + lVar8);
  goto LAB_00108c36;
  while( true ) {
    pNVar3 = (t->h).node;
    lVar5 = lVar8 + 0x28;
    if (*(int *)((long)&pNVar3[1].i_val.tt + lVar8) != 0) break;
LAB_00108c08:
    lVar8 = lVar5;
    lVar4 = lVar4 + 1;
    if ((0x100000000 << ((t->h).lsizenode & 0x3f)) >> 0x20 <= lVar4) {
      pTVar9[-1].tt = 0;
      goto LAB_00108c54;
    }
  }
  pTVar9[-1].value = *(Value *)((long)&pNVar3[1].i_key + lVar8);
  pTVar9[-1].tt = *(int *)((long)&pNVar3[1].i_key + lVar8 + 8);
  pVVar7 = (Value *)((long)&(t->h).node[1].i_val.value + lVar8);
LAB_00108c36:
  pTVar9->value = *pVVar7;
  pTVar9->tt = pVVar7[1].b;
  pTVar9 = L->top + 1;
  iVar10 = 2;
LAB_00108c54:
  L->top = pTVar9;
  return iVar10;
}

Assistant:

static int luaB_next(lua_State*L){
luaL_checktype(L,1,5);
lua_settop(L,2);
if(lua_next(L,1))
return 2;
else{
lua_pushnil(L);
return 1;
}
}